

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O3

Instr * __thiscall
Peeps::HoistSameInstructionAboveSplit(Peeps *this,BranchInstr *branchInstr,Instr *instrNext)

{
  IRKind IVar1;
  OpCode OVar2;
  LabelInstr *oldLabelInstr;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  BranchInstr *pBVar7;
  LabelInstr *pLVar8;
  BranchInstr *this_00;
  Instr *pIVar9;
  Instr *pIVar10;
  BranchInstr *instr1;
  undefined4 *local_50;
  Instr *local_48;
  Instr *local_38;
  
  if (branchInstr == (BranchInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x2aa,"(branchInstr)","branchInstr");
    if (!bVar4) goto LAB_0061d311;
    *puVar5 = 0;
  }
  OVar2 = (branchInstr->super_Instr).m_opcode;
  if (OVar2 < ADD) {
    if (OVar2 == Br) {
      return instrNext;
    }
    if (OVar2 == MultiBr) {
      return instrNext;
    }
  }
  else {
    bVar4 = LowererMD::IsUnconditionalBranch(&branchInstr->super_Instr);
    if (bVar4) {
      return instrNext;
    }
  }
  if (branchInstr->m_branchTarget == (LabelInstr *)0x0) {
    if (branchInstr->m_isMultiBranch != false) {
      return instrNext;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x20e,"(m_isMultiBranch)","m_isMultiBranch");
    if (bVar4) {
      *puVar5 = 0;
      return instrNext;
    }
    goto LAB_0061d311;
  }
  if (branchInstr->m_isMultiBranch != false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x209,"(!m_isMultiBranch)","!m_isMultiBranch");
    if (!bVar4) goto LAB_0061d311;
    *puVar5 = 0;
  }
  if ((branchInstr->super_Instr).m_opcode < ADD) {
    return instrNext;
  }
  oldLabelInstr = branchInstr->m_branchTarget;
  if (oldLabelInstr == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x2b1,"(targetLabel)","targetLabel");
    if (!bVar4) goto LAB_0061d311;
    *puVar5 = 0;
  }
  if (1 < (oldLabelInstr->labelRefs).
          super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
          super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.
          count) {
    return instrNext;
  }
  pIVar6 = IR::Instr::GetPrevRealInstrOrLabel(&oldLabelInstr->super_Instr);
  if (pIVar6 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,699,"(targetPrev)","targetPrev");
    if (!bVar4) goto LAB_0061d311;
    *puVar5 = 0;
  }
  if (pIVar6->m_kind == InstrKindBranch) {
    OVar2 = pIVar6->m_opcode;
    if (OVar2 < ADD) {
      if ((OVar2 != Br) && (OVar2 != MultiBr)) goto LAB_0061cfb2;
    }
    else {
      bVar4 = LowererMD::IsUnconditionalBranch(pIVar6);
      if (!bVar4) goto LAB_0061cfb2;
    }
  }
  else {
LAB_0061cfb2:
    bVar4 = OpCodeAttr::HasFallThrough(pIVar6->m_opcode);
    if (bVar4) {
      return instrNext;
    }
  }
  pBVar7 = (BranchInstr *)IR::Instr::GetPrevRealInstrOrLabel(&branchInstr->super_Instr);
  if (pBVar7 == (BranchInstr *)0x0) {
    return instrNext;
  }
  instr1 = (BranchInstr *)0x0;
  do {
    IVar1 = (pBVar7->super_Instr).m_kind;
    if ((IVar1 == InstrKindLabel) || (IVar1 == InstrKindProfiledLabel)) {
      pLVar8 = IR::Instr::AsLabelInstr(&pBVar7->super_Instr);
      if (instr1 == (BranchInstr *)0x0 || (pLVar8->field_0x78 & 2) != 0) {
        return instrNext;
      }
      goto LAB_0061d045;
    }
    if (IVar1 == InstrKindEntry) break;
    if (instr1 == (BranchInstr *)0x0) {
      bVar4 = EncoderMD::SetsConditionCode(&pBVar7->super_Instr);
      instr1 = (BranchInstr *)0x0;
      if (bVar4) {
        instr1 = pBVar7;
      }
    }
    pBVar7 = (BranchInstr *)IR::Instr::GetPrevRealInstrOrLabel(&pBVar7->super_Instr);
  } while (pBVar7 != (BranchInstr *)0x0);
  if (instr1 == (BranchInstr *)0x0) {
    return instrNext;
  }
LAB_0061d045:
  pBVar7 = (BranchInstr *)IR::Instr::GetPrevRealInstrOrLabel(&branchInstr->super_Instr);
  pIVar6 = IR::Instr::GetNextRealInstrOrLabel(&branchInstr->super_Instr);
  local_48 = IR::Instr::GetNextRealInstrOrLabel(&oldLabelInstr->super_Instr);
  if (local_48 == (Instr *)0x0 || pIVar6 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_50 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *local_50 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x2e3,"(instr && targetInstr)","instr && targetInstr");
    if (!bVar4) {
LAB_0061d311:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *local_50 = 0;
  }
  else {
    local_50 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  this_00 = branchInstr;
  if (instr1 == pBVar7) {
    this_00 = instr1;
  }
  local_38 = (Instr *)0x0;
  while ((((((IVar1 = pIVar6->m_kind, IVar1 != InstrKindBranch && (IVar1 != InstrKindExit)) &&
            (2 < pIVar6->m_opcode - 0x23)) &&
           ((1 < pIVar6->m_opcode - 0x173 && (IVar1 != InstrKindLabel)))) &&
          ((IVar1 != InstrKindProfiledLabel &&
           ((bVar4 = IR::Instr::IsEqual(pIVar6,local_48), bVar4 &&
            (bVar4 = EncoderMD::UsesConditionCode(pIVar6), !bVar4)))))) &&
         ((bVar4 = EncoderMD::SetsConditionCode(pIVar6), !bVar4 &&
          ((bVar4 = AgenPeeps::DependentInstrs(&this->peepsAgen,&instr1->super_Instr,pIVar6), !bVar4
           && (pIVar6->m_opcode != InlineeStart))))))) {
    pIVar9 = IR::Instr::GetNextRealInstrOrLabel(pIVar6);
    pIVar10 = IR::Instr::GetNextRealInstrOrLabel(local_48);
    IR::Instr::Unlink(pIVar6);
    IR::Instr::InsertBefore(&this_00->super_Instr,pIVar6);
    IR::Instr::Remove(local_48);
    if (local_38 == (Instr *)0x0) {
      local_38 = pIVar6;
    }
    pIVar6 = pIVar9;
    local_48 = pIVar10;
    if ((pIVar9 == (Instr *)0x0) || (pIVar10 == (Instr *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_50 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                         ,0x2fe,"(instr && targetInstr)","instr && targetInstr");
      if (!bVar4) goto LAB_0061d311;
      *local_50 = 0;
    }
  }
  if (local_38 == (Instr *)0x0) {
    return instrNext;
  }
  if (local_48->m_kind != InstrKindBranch) {
    return local_38;
  }
  pBVar7 = IR::Instr::AsBranchInstr(local_48);
  OVar2 = (pBVar7->super_Instr).m_opcode;
  if (OVar2 < ADD) {
    if ((OVar2 != MultiBr) && (OVar2 != Br)) goto LAB_0061d2d0;
  }
  else {
    bVar4 = LowererMD::IsUnconditionalBranch(&pBVar7->super_Instr);
    if (!bVar4) goto LAB_0061d2d0;
  }
  bVar4 = IR::BranchInstr::IsMultiBranch(pBVar7);
  if (!bVar4) {
    IR::BranchInstr::ReplaceTarget(branchInstr,oldLabelInstr,pBVar7->m_branchTarget);
  }
LAB_0061d2d0:
  if ((oldLabelInstr->field_0x78 & 4) == 0 &&
      (SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
      (oldLabelInstr->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next == &oldLabelInstr->labelRefs) {
    PeepUnreachableLabel(oldLabelInstr,(bool)((oldLabelInstr->field_0x78 & 2) >> 1),(bool *)0x0);
  }
  return local_38;
}

Assistant:

IR::Instr *
Peeps::HoistSameInstructionAboveSplit(IR::BranchInstr *branchInstr, IR::Instr *instrNext)
{
    Assert(branchInstr);
    if (!branchInstr->IsConditional() || branchInstr->IsMultiBranch() || !branchInstr->IsLowered())
    {
        return instrNext;   // this optimization only applies to single conditional branch
    }

    IR::LabelInstr *targetLabel = branchInstr->GetTarget();
    Assert(targetLabel);

    // give up if there are other branch entries to the target label
    if (targetLabel->labelRefs.Count() > 1)
    {
        return instrNext;
    }

    // Give up if previous instruction before target label has fallthrough, cannot hoist up
    IR::Instr *targetPrev = targetLabel->GetPrevRealInstrOrLabel();
    Assert(targetPrev);
    if (targetPrev->HasFallThrough())
    {
        return instrNext;
    }

    IR::Instr *instrSetCondition = NULL;
    IR::Instr *branchPrev = branchInstr->GetPrevRealInstrOrLabel();
    while (branchPrev && !branchPrev->StartsBasicBlock())
    {
        if (!instrSetCondition && EncoderMD::SetsConditionCode(branchPrev))
        {   // located compare instruction for the branch
            instrSetCondition = branchPrev;
        }
        branchPrev = branchPrev->GetPrevRealInstrOrLabel(); // keep looking previous instr in BB
    }

    if (branchPrev && branchPrev->IsLabelInstr() && branchPrev->AsLabelInstr()->isOpHelper)
    {   // don't apply the optimization when branch is in helper section
        return instrNext;
    }

    if (!instrSetCondition)
    {   // give up if we cannot find the compare instruction in the BB, should be very rare
        return instrNext;
    }
    Assert(instrSetCondition);

    bool hoistAboveSetConditionInstr = false;
    if (instrSetCondition == branchInstr->GetPrevRealInstrOrLabel())
    {   // if compare instruction is right before branch instruction, we can hoist above cmp instr
        hoistAboveSetConditionInstr = true;
    }   // otherwise we hoist the identical instructions above conditional branch split only

    IR::Instr *instr = branchInstr->GetNextRealInstrOrLabel();
    IR::Instr *targetInstr = targetLabel->GetNextRealInstrOrLabel();
    IR::Instr *branchNextInstr = NULL;
    IR::Instr *targetNextInstr = NULL;
    IR::Instr *instrHasHoisted = NULL;

    Assert(instr && targetInstr);
    while (!instr->EndsBasicBlock() && !instr->IsLabelInstr() && instr->IsEqual(targetInstr) &&
        !EncoderMD::UsesConditionCode(instr) && !EncoderMD::SetsConditionCode(instr) &&
        !this->peepsAgen.DependentInstrs(instrSetCondition, instr) &&
        // cannot hoist InlineeStart from branch targets even for the same inlinee function.
        // it is used by encoder to generate InlineeFrameRecord for each inlinee
        instr->m_opcode != Js::OpCode::InlineeStart)
    {
        branchNextInstr = instr->GetNextRealInstrOrLabel();
        targetNextInstr = targetInstr->GetNextRealInstrOrLabel();

        instr->Unlink();                            // hoist up instr in fallthrough branch
        if (hoistAboveSetConditionInstr)
        {
            instrSetCondition->InsertBefore(instr); // hoist above compare instruction
        }
        else
        {
            branchInstr->InsertBefore(instr);       // hoist above branch split
        }
        targetInstr->Remove();                      // remove the same instruction in target branch

        if (!instrHasHoisted)
            instrHasHoisted = instr;                // points to the first hoisted instruction

        instr = branchNextInstr;
        targetInstr = targetNextInstr;
        Assert(instr && targetInstr);
    }

    if (instrHasHoisted)
    {   // instructions have been hoisted, now check tail branch to see if it can be duplicated
        if (targetInstr->IsBranchInstr())
        {
            IR::BranchInstr *tailBranch = targetInstr->AsBranchInstr();
            if (tailBranch->IsUnconditional() && !tailBranch->IsMultiBranch())
            {   // target can be replaced since tail branch is a single unconditional jmp
                branchInstr->ReplaceTarget(targetLabel, tailBranch->GetTarget());
            }

            // now targeLabel is an empty Basic Block, remove it if it's not referenced
            if (targetLabel->IsUnreferenced())
            {
                Peeps::PeepUnreachableLabel(targetLabel, targetLabel->isOpHelper);
            }
        }
        return instrHasHoisted;
    }

    return instrNext;
}